

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::sendError(Connection *this,Exception *exception)

{
  HttpServerErrorHandler *pHVar1;
  Exception *other;
  Promise<void> *pPVar2;
  PromiseBase in_RDX;
  Promise<void> local_1e0 [3];
  Exception *local_1c8;
  undefined1 local_1c0 [408];
  Promise<void> local_28;
  Promise<void> promise;
  Exception *exception_local;
  Connection *this_local;
  
  *(undefined1 *)((long)exception->trace + 0xfc) = 1;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)in_RDX.node.ptr;
  pHVar1 = Maybe<kj::HttpServerErrorHandler_&>::orDefault
                     ((Maybe<kj::HttpServerErrorHandler_&> *)(exception->file + 0x50),
                      (HttpServerErrorHandler *)&(exception->ownFile).content.disposer);
  other = mv<kj::Exception>((Exception *)promise.super_PromiseBase.node.ptr);
  Exception::Exception((Exception *)(local_1c0 + 8),other);
  local_1c8 = exception;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:8034:46)>
            ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_1c0,
             (anon_class_8_1_8991fb9c *)(exception->trace + 0x1c));
  (*pHVar1->_vptr_HttpServerErrorHandler[1])(&local_28,pHVar1,local_1c0 + 8,local_1c0);
  Exception::~Exception((Exception *)(local_1c0 + 8));
  pPVar2 = mv<kj::Promise<void>>(&local_28);
  Promise<void>::Promise(local_1e0,pPVar2);
  finishSendingError(this,(Promise<void> *)exception);
  Promise<void>::~Promise(local_1e0);
  Promise<void>::~Promise(&local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> sendError(kj::Exception&& exception) {
    closeAfterSend = true;

    // We only provide the Response object if we know we haven't already sent a response.
    auto promise = server.settings.errorHandler.orDefault(*this).handleApplicationError(
        kj::mv(exception), currentMethod.map([this](auto&&) -> Response& { return *this; }));
    return finishSendingError(kj::mv(promise));
  }